

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int convert(int argc,char **argv)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  polymorphic_allocator<int> pVar3;
  size_t sVar4;
  float *pfVar5;
  bool bVar6;
  bool bVar7;
  Allocator AVar8;
  RGBColorSpace **ppRVar9;
  Tuple2<pbrt::Point2,_int> TVar10;
  Tuple2<pbrt::Point2,_int> TVar11;
  Tuple2<pbrt::Point2,_int> TVar12;
  Tuple2<pbrt::Point2,_int> TVar13;
  Tuple2<pbrt::Point2,_int> TVar14;
  Tuple2<pbrt::Point2,_int> TVar15;
  Tuple2<pbrt::Point2,_int> TVar16;
  Tuple2<pbrt::Point2,_int> TVar17;
  ulong uVar18;
  int iVar19;
  Tuple2<pbrt::Point2,_int> TVar20;
  int iVar21;
  ImageChannelValues *b;
  ImageChannelValues *extraout_RDX;
  ImageChannelValues *extraout_RDX_00;
  ImageChannelValues *extraout_RDX_01;
  ImageChannelValues *extraout_RDX_02;
  ImageChannelValues *extraout_RDX_03;
  ImageChannelValues *extraout_RDX_04;
  ImageChannelValues *extraout_RDX_05;
  ImageChannelValues *extraout_RDX_06;
  ImageChannelValues *extraout_RDX_07;
  ImageChannelValues *pIVar22;
  ImageChannelValues *extraout_RDX_08;
  ImageChannelValues *extraout_RDX_09;
  ImageChannelValues *extraout_RDX_10;
  string *name;
  polymorphic_allocator<float> __lhs;
  long lVar23;
  RGBColorSpace **ppRVar24;
  Point2i PVar25;
  Tuple2<pbrt::Point2,_int> TVar26;
  ulong uVar27;
  Tuple2<pbrt::Point2,_int> TVar28;
  char *msg;
  char ch;
  _Any_data *p_Var29;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  int c;
  uint uVar30;
  int iVar31;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *other;
  int dx;
  uint uVar32;
  int iVar33;
  int c_8;
  int iVar34;
  Tuple2<pbrt::Point2,_int> TVar35;
  Tuple2<pbrt::Point2,_int> TVar36;
  Tuple2<pbrt::Point2,_int> TVar37;
  Point2i PVar38;
  Float FVar39;
  float fVar40;
  Float FVar41;
  undefined1 auVar42 [16];
  undefined1 extraout_var_02 [56];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar48 [16];
  span<int> out;
  span<const_float> values;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  string_view str;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  RGB RVar49;
  bool preserveColors;
  bool tonemap;
  bool flipy;
  Float local_a50;
  undefined4 uStack_a4c;
  Tuple2<pbrt::Point2,_int> local_a48;
  Tuple2<pbrt::Point2,_int> local_a40;
  Tuple2<pbrt::Point2,_int> local_a38;
  bool bw;
  bool acesFilmic;
  Tuple2<pbrt::Point2,_int> local_a28;
  ulong local_a20;
  int repeat;
  Tuple2<pbrt::Point2,_int> local_a10;
  ulong local_a08;
  float scale;
  Float despikeLimit;
  Float maxY;
  float gamma;
  allocator<char> local_9ea;
  allocator<char> local_9e9;
  allocator<char> local_9e8;
  allocator<char> local_9e7;
  allocator<char> local_9e6;
  allocator<char> local_9e5;
  allocator<char> local_9e4;
  allocator<char> local_9e3;
  allocator<char> local_9e2;
  allocator<char> local_9e1;
  allocator<char> local_9e0;
  allocator<char> local_9df;
  allocator<char> local_9de;
  allocator<char> local_9dd;
  uint local_9dc;
  array<int,_4UL> cropWindow;
  ImageChannelDesc desc;
  char **argv_local;
  vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> neighbors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitChannelNames;
  string inFile;
  string channelNames;
  _Any_data local_8f8;
  code *local_8e8;
  code *local_8e0;
  Tuple2<pbrt::Point2,_int> local_8d0;
  ulong local_8c8;
  WrapMode2D local_8c0;
  WrapMode2D local_8b8;
  WrapMode2D local_8b0;
  WrapMode2D local_8a8;
  WrapMode2D local_8a0;
  WrapMode2D local_898;
  WrapMode2D local_890;
  WrapMode2D local_888;
  WrapMode2D local_880;
  WrapMode2D local_878;
  WrapMode2D local_870;
  WrapMode2D local_868;
  WrapMode2D local_860;
  _Any_data local_858;
  code *local_848;
  code *local_840;
  string colorspace;
  string outFile;
  _Any_data local_7f8;
  code *local_7e8;
  code *local_7e0;
  _Any_data local_7d8;
  code *local_7c8;
  code *local_7c0;
  _Any_data local_7b8;
  code *local_7a8;
  code *local_7a0;
  _Any_data local_798;
  code *local_788;
  code *local_780;
  _Any_data local_778;
  code *local_768;
  code *local_760;
  _Any_data local_758;
  code *local_748;
  code *local_740;
  _Any_data local_738;
  code *local_728;
  code *local_720;
  _Any_data local_718;
  code *local_708;
  code *local_700;
  _Any_data local_6f8;
  code *local_6e8;
  code *local_6e0;
  _Any_data local_6d8;
  code *local_6c8;
  code *local_6c0;
  _Any_data local_6b8;
  code *local_6a8;
  code *local_6a0;
  RGBColorSpace *dest;
  ImageChannelValues channels;
  string local_638 [80];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_5e8;
  size_t sStack_5d8;
  size_t local_5d0;
  optional<int> oStack_5c8;
  optional<float> oStack_5c0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_5b8;
  size_t sStack_5b0;
  size_t sStack_5a8;
  polymorphic_allocator<pbrt::Half> pStack_5a0;
  _Base_ptr p_Stack_598;
  _Base_ptr local_590;
  _Base_ptr local_588;
  polymorphic_allocator<float> local_580;
  _Any_data local_558;
  code *local_548;
  code *local_540;
  Image image;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_420;
  ColorEncodingHandle local_418;
  ColorEncodingHandle local_410;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  ImageMetadata metadata;
  ImageAndMetadata imRead;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar47 [56];
  
  gamma = 1.0;
  scale = 1.0;
  repeat = 1;
  p_Var29 = (_Any_data *)&tonemap;
  acesFilmic = false;
  bw = false;
  flipy = false;
  preserveColors = false;
  outFile._M_dataplus._M_p = (pointer)&outFile.field_2;
  tonemap = false;
  maxY = 1.0;
  outFile._M_string_length = 0;
  outFile.field_2._M_local_buf[0] = '\0';
  channelNames._M_dataplus._M_p = (pointer)&channelNames.field_2;
  despikeLimit = INFINITY;
  inFile._M_dataplus._M_p = (pointer)&inFile.field_2;
  channelNames._M_string_length = 0;
  channelNames.field_2._M_local_buf[0] = '\0';
  inFile._M_string_length = 0;
  inFile.field_2._M_local_buf[0] = '\0';
  colorspace._M_dataplus._M_p = (pointer)&colorspace.field_2;
  colorspace._M_string_length = 0;
  colorspace.field_2._M_local_buf[0] = '\0';
  cropWindow._M_elems[0] = -1;
  cropWindow._M_elems[1] = 0;
  cropWindow._M_elems[2] = -1;
  cropWindow._M_elems[3] = 0;
  argv_local = argv;
LAB_002601e1:
  if (*argv_local != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&imRead,"acesfilmic",&local_9dd);
    local_8f8._M_unused._M_object = (void *)0x0;
    local_8f8._8_8_ = 0;
    local_8e0 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                ::_M_invoke;
    local_8e8 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                ::_M_manager;
    bVar6 = pbrt::ParseArg<bool*>
                      (&argv_local,(string *)&imRead,&acesFilmic,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_8f8);
    if (!bVar6) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&image,"bw",&local_9de);
      local_858._M_unused._M_object = (void *)0x0;
      local_858._8_8_ = 0;
      local_840 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                  ::_M_invoke;
      local_848 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                  ::_M_manager;
      bVar6 = pbrt::ParseArg<bool*>
                        (&argv_local,(string *)&image,&bw,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_858);
      if (!bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&channels,"channels",&local_9df);
        local_6b8._M_unused._M_object = (void *)0x0;
        local_6b8._8_8_ = 0;
        local_6a0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                    ::_M_invoke;
        local_6a8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                    ::_M_manager;
        bVar6 = pbrt::ParseArg<std::__cxx11::string*>
                          (&argv_local,(string *)&channels,&channelNames,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_6b8);
        bVar7 = true;
        if (!bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&metadata,"colorspace",&local_9e0);
          local_6d8._M_unused._M_object = (void *)0x0;
          local_6d8._8_8_ = 0;
          local_6c0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_6c8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar6 = pbrt::ParseArg<std::__cxx11::string*>
                            (&argv_local,(string *)&metadata,&colorspace,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_6d8);
          bVar7 = true;
          if (!bVar6) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&desc,"crop",&local_9e1);
            local_6f8._M_unused._M_object = (void *)0x0;
            local_6f8._8_8_ = 0;
            local_6e0 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                        ::_M_invoke;
            local_6e8 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                        ::_M_manager;
            p_Var29 = &local_6f8;
            out.n = (size_t)p_Var29;
            out.ptr = (int *)0x4;
            bVar6 = pbrt::ParseArg<pstd::span<int>>
                              ((pbrt *)&argv_local,(char ***)&desc,(string *)&cropWindow,out,in_R9);
            bVar7 = true;
            if (!bVar6) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&splitChannelNames,"despike",&local_9e2);
              local_718._M_unused._M_object = (void *)0x0;
              local_718._8_8_ = 0;
              local_700 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                          ::_M_invoke;
              local_708 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                          ::_M_manager;
              bVar6 = pbrt::ParseArg<float*>
                                (&argv_local,(string *)&splitChannelNames,&despikeLimit,
                                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                  *)&local_718);
              bVar7 = true;
              if (!bVar6) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&neighbors,"flipy",&local_9e3);
                local_738._M_unused._M_object = (void *)0x0;
                local_738._8_8_ = 0;
                local_720 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                            ::_M_invoke;
                local_728 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                            ::_M_manager;
                bVar6 = pbrt::ParseArg<bool*>
                                  (&argv_local,(string *)&neighbors,&flipy,
                                   (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                    *)&local_738);
                bVar7 = true;
                if (!bVar6) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&dest,"gamma",&local_9e4);
                  local_758._M_unused._M_object = (void *)0x0;
                  local_758._8_8_ = 0;
                  local_740 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                              ::_M_invoke;
                  local_748 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                              ::_M_manager;
                  bVar6 = pbrt::ParseArg<float*>
                                    (&argv_local,(string *)&dest,&gamma,
                                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      *)&local_758);
                  bVar7 = true;
                  if (!bVar6) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_408,"maxluminance",&local_9e5);
                    local_778._M_unused._M_object = (void *)0x0;
                    local_778._8_8_ = 0;
                    local_760 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                ::_M_invoke;
                    local_768 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                ::_M_manager;
                    bVar6 = pbrt::ParseArg<float*>
                                      (&argv_local,&local_408,&maxY,
                                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        *)&local_778);
                    bVar7 = true;
                    if (!bVar6) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_368,"outfile",&local_9e6);
                      local_798._M_unused._M_object = (void *)0x0;
                      local_798._8_8_ = 0;
                      local_780 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                  ::_M_invoke;
                      local_788 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                  ::_M_manager;
                      bVar6 = pbrt::ParseArg<std::__cxx11::string*>
                                        (&argv_local,&local_368,&outFile,
                                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                          *)&local_798);
                      bVar7 = true;
                      if (!bVar6) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_388,"preservecolors",&local_9e7);
                        local_7b8._M_unused._M_object = (void *)0x0;
                        local_7b8._8_8_ = 0;
                        local_7a0 = std::
                                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                    ::_M_invoke;
                        local_7a8 = std::
                                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                    ::_M_manager;
                        bVar6 = pbrt::ParseArg<bool*>
                                          (&argv_local,&local_388,&preserveColors,
                                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                            *)&local_7b8);
                        bVar7 = true;
                        if (!bVar6) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_3a8,"repeatpix",&local_9e8);
                          local_7d8._M_unused._M_object = (void *)0x0;
                          local_7d8._8_8_ = 0;
                          local_7c0 = std::
                                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                      ::_M_invoke;
                          local_7c8 = std::
                                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                      ::_M_manager;
                          bVar6 = pbrt::ParseArg<int*>
                                            (&argv_local,&local_3a8,&repeat,
                                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                              *)&local_7d8);
                          bVar7 = true;
                          if (!bVar6) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_3c8,"scale",&local_9e9);
                            local_7f8._M_unused._M_object = (void *)0x0;
                            local_7f8._8_8_ = 0;
                            local_7e0 = std::
                                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                        ::_M_invoke;
                            local_7e8 = std::
                                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                        ::_M_manager;
                            bVar6 = pbrt::ParseArg<float*>
                                              (&argv_local,&local_3c8,&scale,
                                               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                *)&local_7f8);
                            bVar7 = true;
                            if (!bVar6) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_3e8,"tonemap",&local_9ea);
                              local_558._M_unused._M_object = (void *)0x0;
                              local_558._8_8_ = 0;
                              local_540 = std::
                                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                          ::_M_invoke;
                              local_548 = std::
                                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                          ::_M_manager;
                              bVar7 = pbrt::ParseArg<bool*>
                                                (&argv_local,&local_3e8,&tonemap,
                                                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_558);
                              std::_Function_base::~_Function_base((_Function_base *)&local_558);
                              std::__cxx11::string::~string((string *)&local_3e8);
                            }
                            std::_Function_base::~_Function_base((_Function_base *)&local_7f8);
                            std::__cxx11::string::~string((string *)&local_3c8);
                          }
                          std::_Function_base::~_Function_base((_Function_base *)&local_7d8);
                          std::__cxx11::string::~string((string *)&local_3a8);
                        }
                        std::_Function_base::~_Function_base((_Function_base *)&local_7b8);
                        std::__cxx11::string::~string((string *)&local_388);
                      }
                      std::_Function_base::~_Function_base((_Function_base *)&local_798);
                      std::__cxx11::string::~string((string *)&local_368);
                    }
                    std::_Function_base::~_Function_base((_Function_base *)&local_778);
                    std::__cxx11::string::~string((string *)&local_408);
                  }
                  std::_Function_base::~_Function_base((_Function_base *)&local_758);
                  std::__cxx11::string::~string((string *)&dest);
                }
                std::_Function_base::~_Function_base((_Function_base *)&local_738);
                std::__cxx11::string::~string((string *)&neighbors);
              }
              std::_Function_base::~_Function_base((_Function_base *)&local_718);
              std::__cxx11::string::~string((string *)&splitChannelNames);
            }
            std::_Function_base::~_Function_base((_Function_base *)&local_6f8);
            std::__cxx11::string::~string((string *)&desc);
          }
          std::_Function_base::~_Function_base((_Function_base *)&local_6d8);
          std::__cxx11::string::~string((string *)&metadata);
        }
        std::_Function_base::~_Function_base((_Function_base *)&local_6b8);
        std::__cxx11::string::~string((string *)&channels);
        std::_Function_base::~_Function_base((_Function_base *)&local_858);
        std::__cxx11::string::~string((string *)&image);
        std::_Function_base::~_Function_base((_Function_base *)&local_8f8);
        std::__cxx11::string::~string((string *)&imRead);
        if (bVar7 == false) {
          if ((**argv_local == '-') || (inFile._M_string_length != 0)) {
            usage("convert","%s: unknown command flag");
          }
          std::__cxx11::string::assign((char *)&inFile);
          argv_local = argv_local + 1;
        }
        goto LAB_002601e1;
      }
      std::_Function_base::~_Function_base((_Function_base *)&local_858);
      std::__cxx11::string::~string((string *)&image);
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_8f8);
    std::__cxx11::string::~string((string *)&imRead);
    goto LAB_002601e1;
  }
  if (maxY <= 0.0) {
    msg = "--maxluminance value must be greater than zero";
LAB_00261fa0:
    usage("convert",msg);
  }
  if (repeat < 1) {
    msg = "--repeatpix value must be greater than zero";
    goto LAB_00261fa0;
  }
  if ((scale == 0.0) && (!NAN(scale))) {
    msg = "--scale value must be non-zero";
    goto LAB_00261fa0;
  }
  if (outFile._M_string_length == 0) {
    msg = "--outfile filename must be specified";
    goto LAB_00261fa0;
  }
  if (inFile._M_string_length == 0) {
    msg = "input filename not specified";
    goto LAB_00261fa0;
  }
  AVar8.memoryResource = pstd::pmr::new_delete_resource();
  local_410.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&imRead,&inFile,AVar8,&local_410);
  pbrt::Image::Image(&image,&imRead.image);
  pbrt::ImageMetadata::ImageMetadata(&metadata,&imRead.metadata);
  ch = (char)p_Var29;
  if (channelNames._M_string_length == 0) {
    pbrt::Image::ChannelNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&channels,&image);
    pfVar5 = channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
    for (__lhs = channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                 alloc; ch = (char)p_Var29, __lhs.memoryResource != (memory_resource *)pfVar5;
        __lhs.memoryResource = (memory_resource *)((long)__lhs.memoryResource + 0x20)) {
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs.memoryResource,"R");
      if (((bVar6) &&
          (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__lhs.memoryResource,"G"), bVar6)) &&
         (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs.memoryResource,"B"), bVar6)) {
        bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs.memoryResource,"A");
        ch = (char)p_Var29;
        if (bVar6) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&channels);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&channels,"exr",(allocator<char> *)&desc);
          bVar6 = pbrt::HasExtension(&outFile,(string *)&channels);
          std::__cxx11::string::~string((string *)&channels);
          if (!bVar6) {
            fprintf(_stderr,
                    "%s: image has non-RGB channels but converting to an image format that can\'t store them. Converting RGB only.\n"
                    ,inFile._M_dataplus._M_p);
            std::__cxx11::string::assign((char *)&channelNames);
          }
          goto LAB_00260b0d;
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&channels);
LAB_00260b0d:
    if (channelNames._M_string_length != 0) goto LAB_00260b1e;
  }
  else {
LAB_00260b1e:
    uVar32 = 1;
    str._M_str = (char *)0x2c;
    str._M_len = (size_t)channelNames._M_dataplus._M_p;
    pbrt::SplitString_abi_cxx11_(&splitChannelNames,(pbrt *)channelNames._M_string_length,str,ch);
    requestedChannels.n =
         (long)splitChannelNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)splitChannelNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5;
    requestedChannels.ptr =
         splitChannelNames.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pbrt::Image::GetChannelDesc(&desc,&image,requestedChannels);
    sVar4 = desc.offset.nStored;
    if (desc.offset.nStored == 0) {
      fprintf(_stderr,"%s: image doesn\'t have channels \"%s\".\n",inFile._M_dataplus._M_p,
              channelNames._M_dataplus._M_p);
    }
    else {
      AVar8.memoryResource = pstd::pmr::new_delete_resource();
      pbrt::Image::SelectChannels((Image *)&channels,&image,&desc,AVar8);
      pbrt::Image::operator=(&image,(Image *)&channels);
      pbrt::Image::~Image((Image *)&channels);
    }
    pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&desc.offset);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&splitChannelNames);
    if (sVar4 == 0) goto LAB_002618b6;
  }
  uVar32 = 1;
  iVar19 = cropWindow._M_elems[1];
  if ((long)cropWindow._M_elems._0_8_ < 0) {
    iVar19 = cropWindow._M_elems[0] - cropWindow._M_elems[1];
    cropWindow._M_elems[1] = iVar19;
  }
  iVar21 = cropWindow._M_elems[3];
  if ((long)cropWindow._M_elems._8_8_ < 0) {
    iVar21 = cropWindow._M_elems[2] - cropWindow._M_elems[3];
    cropWindow._M_elems[3] = iVar21;
  }
  local_a28 = image.resolution.super_Tuple2<pbrt::Point2,_int>;
  local_a08 = CONCAT44(local_a08._4_4_,(int)image.channelNames.nStored);
  if ((-1 < cropWindow._M_elems[0]) && (-1 < cropWindow._M_elems[2])) {
    iVar31 = cropWindow._M_elems[0];
    if (iVar19 < cropWindow._M_elems[0]) {
      iVar31 = iVar19;
    }
    iVar33 = cropWindow._M_elems[2];
    if (iVar21 < cropWindow._M_elems[2]) {
      iVar33 = iVar21;
    }
    desc.offset.alloc.memoryResource = (memory_resource *)CONCAT44(iVar33,iVar31);
    if (iVar19 < cropWindow._M_elems[0]) {
      iVar19 = cropWindow._M_elems[0];
    }
    if (iVar21 < cropWindow._M_elems[2]) {
      iVar21 = cropWindow._M_elems[2];
    }
    desc.offset.ptr = (int *)CONCAT44(iVar21,iVar19);
    AVar8.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Image::Crop((Image *)&channels,&image,(Bounds2i *)&desc,AVar8);
    pbrt::Image::operator=(&image,(Image *)&channels);
    pbrt::Image::~Image((Image *)&channels);
    local_a28 = image.resolution.super_Tuple2<pbrt::Point2,_int>;
  }
  if (image.format != Float) {
    local_418.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::ConvertToFormat((Image *)&channels,&image,Float,&local_418);
    pbrt::Image::operator=(&image,(Image *)&channels);
    pbrt::Image::~Image((Image *)&channels);
  }
  local_a20 = (ulong)local_a28 >> 0x20;
  if (colorspace._M_string_length != 0) {
    dest = pbrt::RGBColorSpace::GetNamed(&colorspace);
    if (dest == (RGBColorSpace *)0x0) {
      fprintf(_stderr,"%s: color space unknown.\n",colorspace._M_dataplus._M_p);
      goto LAB_002618b6;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&channels,"R",(allocator<char> *)&splitChannelNames);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                nAlloc,"G",(allocator<char> *)&neighbors);
    std::__cxx11::string::string<std::allocator<char>>(local_638,"B",(allocator<char> *)&local_408);
    requestedChannels_00.n = 3;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&channels;
    pbrt::Image::GetChannelDesc(&desc,&image,requestedChannels_00);
    lVar23 = 0x40;
    do {
      auVar43._0_8_ =
           std::__cxx11::string::~string
                     ((string *)
                      ((long)&channels.
                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                              .alloc.memoryResource + lVar23));
      auVar43._8_56_ = extraout_var_02;
      lVar23 = lVar23 + -0x20;
    } while (lVar23 != -0x20);
    if (desc.offset.nStored == 0) {
      fprintf(_stderr,"%s: doesn\'t have R, G, B channels.\n",inFile._M_dataplus._M_p);
    }
    else {
      ppRVar24 = (RGBColorSpace **)&pbrt::RGBColorSpace::sRGB;
      if ((metadata.colorSpace.set == true) &&
         (ppRVar9 = pstd::optional<const_pbrt::RGBColorSpace_*>::value(&metadata.colorSpace),
         *ppRVar9 != (RGBColorSpace *)0x0)) {
        ppRVar24 = pstd::optional<const_pbrt::RGBColorSpace_*>::value(&metadata.colorSpace);
      }
      local_a38.x = (undefined4)desc.offset.nStored;
      local_a38.y = desc.offset.nStored._4_4_;
      pbrt::ConvertRGBColorSpace((SquareMatrix<3> *)&splitChannelNames,*ppRVar24,dest);
      TVar36.x = 0;
      TVar36.y = 0;
      local_a48.x = ~(local_a28.x >> 0x1f) & local_a28.x;
      local_a48.y = 0;
      local_a50 = (Float)(~((int)(uint)local_a20 >> 0x1f) & (uint)local_a20);
      uStack_a4c = 0;
      local_a40.x = 0;
      local_a40.y = 0;
      for (; TVar35 = TVar36, TVar37 = local_a48, local_a40 != (Tuple2<pbrt::Point2,_int>)_local_a50
          ; local_a40 = (Tuple2<pbrt::Point2,_int>)((long)local_a40 + 1)) {
        while( true ) {
          auVar47 = auVar43._8_56_;
          bVar6 = TVar37 == (Tuple2<pbrt::Point2,_int>)0x0;
          TVar37 = (Tuple2<pbrt::Point2,_int>)((long)TVar37 + -1);
          if (bVar6) break;
          pbrt::WrapMode2D::WrapMode2D(&local_860,Clamp);
          pbrt::Image::GetChannels
                    ((ImageChannelValues *)
                     &channels.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,&image
                     ,(Point2i)TVar35,&desc,local_860);
          RVar49 = pbrt::Mul<pbrt::RGB,3,pbrt::ImageChannelValues>
                             ((SquareMatrix<3> *)&splitChannelNames,
                              (ImageChannelValues *)
                              &channels.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             );
          auVar43._0_8_ = RVar49._0_8_;
          auVar43._8_56_ = auVar47;
          neighbors.
          super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)vmovlps_avx(auVar43._0_16_);
          neighbors.
          super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(neighbors.
                                 super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,RVar49.b);
          values.n = 3;
          values.ptr = (float *)&neighbors;
          pbrt::Image::SetChannels(&image,(Point2i)TVar35,&desc,values);
          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                    (&channels.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
          TVar35 = (Tuple2<pbrt::Point2,_int>)((long)TVar35 + 1);
        }
        TVar36 = (Tuple2<pbrt::Point2,_int>)((long)TVar36 + 0x100000000);
      }
      pstd::optional<const_pbrt::RGBColorSpace_*>::operator=(&metadata.colorSpace,&dest);
      desc.offset.nStored = (size_t)local_a38;
    }
    uVar32 = 1;
    pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&desc.offset);
    if ((Tuple2<pbrt::Point2,_int>)desc.offset.nStored == (Tuple2<pbrt::Point2,_int>)0x0)
    goto LAB_002618b6;
  }
  if (bw == true) {
    uVar32 = ~((int)(uint)local_a08 >> 0x1f) & (uint)local_a08;
    local_a38.x = (int)(float)(int)(uint)local_a08;
    local_a48.x = ~(local_a28.x >> 0x1f) & local_a28.x;
    local_a48.y = 0;
    TVar35.x = ~((int)(uint)local_a20 >> 0x1f) & (uint)local_a20;
    TVar35.y = 0;
    TVar37.x = 0;
    TVar37.y = 0;
    while (TVar37 != TVar35) {
      _local_a50 = (long)TVar37 << 0x20;
      TVar10.x = 0;
      TVar10.y = 0;
      local_a10 = TVar37;
      while (TVar10 != local_a48) {
        fVar40 = 0.0;
        PVar38.super_Tuple2<pbrt::Point2,_int> = _local_a50 | TVar10;
        local_a40 = TVar10;
        for (uVar30 = 0; uVar32 != uVar30; uVar30 = uVar30 + 1) {
          pbrt::WrapMode2D::WrapMode2D(&local_868,Clamp);
          FVar39 = pbrt::Image::GetChannel(&image,PVar38,uVar30,local_868);
          fVar40 = fVar40 + FVar39;
        }
        fVar40 = fVar40 / (float)local_a38.x;
        for (uVar30 = 0; uVar32 != uVar30; uVar30 = uVar30 + 1) {
          pbrt::Image::SetChannel(&image,PVar38,uVar30,fVar40);
        }
        TVar10 = (Tuple2<pbrt::Point2,_int>)((long)local_a40 + 1);
      }
      TVar37 = (Tuple2<pbrt::Point2,_int>)((long)local_a10 + 1);
    }
  }
  if (despikeLimit != INFINITY) {
    pbrt::Image::Image((Image *)&channels,&image);
    neighbors.
    super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    neighbors.
    super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    neighbors.
    super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar19 = 9;
    while (bVar6 = iVar19 != 0, iVar19 = iVar19 + -1, bVar6) {
      pbrt::ImageChannelValues::ImageChannelValues
                ((ImageChannelValues *)&desc,(long)(int)image.channelNames.nStored,0.0);
      std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::
      emplace_back<pbrt::ImageChannelValues>(&neighbors,(ImageChannelValues *)&desc);
      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&desc);
    }
    local_9dc = 0;
    uVar32 = local_a28.x;
    local_8d0.x = ~((int)(uint)local_a20 >> 0x1f) & (uint)local_a20;
    local_8d0.y = 0;
    TVar26.x = 0;
    TVar26.y = 0;
    while (TVar26 != local_8d0) {
      local_8c8 = (long)TVar26 << 0x20;
      local_a40 = TVar26;
      for (uVar27 = 0; uVar27 != (~((int)uVar32 >> 0x1f) & uVar32); uVar27 = uVar27 + 1) {
        pbrt::WrapMode2D::WrapMode2D(&local_870,Clamp);
        local_a38 = (Tuple2<pbrt::Point2,_int>)(local_8c8 | uVar27);
        pbrt::Image::GetChannels((ImageChannelValues *)&desc,&image,(Point2i)local_a38,local_870);
        FVar39 = pbrt::ImageChannelValues::Average((ImageChannelValues *)&desc);
        local_a48.x = (int)FVar39;
        local_a50 = despikeLimit;
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&desc);
        if (local_a50 <= (float)local_a48.x) {
          local_9dc = local_9dc + 1;
          iVar21 = 0;
          for (iVar19 = -1; iVar19 != 2; iVar19 = iVar19 + 1) {
            iVar31 = iVar19 + local_a40.x;
            if ((-1 < iVar31) && (iVar31 < (int)local_a20)) {
              for (iVar33 = -1; iVar33 != 2; iVar33 = iVar33 + 1) {
                iVar34 = (int)uVar27 + iVar33;
                if (-1 < iVar34) {
                  pbrt::WrapMode2D::WrapMode2D(&local_878,Clamp);
                  PVar38.super_Tuple2<pbrt::Point2,_int>.y = iVar31;
                  PVar38.super_Tuple2<pbrt::Point2,_int>.x = iVar34;
                  pbrt::Image::GetChannels((ImageChannelValues *)&desc,&image,PVar38,local_878);
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                            (&neighbors.
                              super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar21].
                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             ,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                              &desc);
                  iVar21 = iVar21 + 1;
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)&desc);
                }
              }
            }
          }
          pIVar22 = (ImageChannelValues *)((long)iVar21 % 2 & 0xffffffff);
          local_a10 = (Tuple2<pbrt::Point2,_int>)((long)(iVar21 / 2) * 0x30);
          if (iVar21 != 0) {
            local_a48 = (Tuple2<pbrt::Point2,_int>)
                        (neighbors.
                         super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar21 / 2);
            _local_a50 = (ulong)(uint)((int)LZCOUNT((long)iVar21) * 2) ^ 0x7e;
            TVar36 = (Tuple2<pbrt::Point2,_int>)
                     neighbors.
                     super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            TVar35 = (Tuple2<pbrt::Point2,_int>)
                     (neighbors.
                      super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar21);
LAB_00261c11:
            TVar37 = TVar35;
            uVar18 = (long)TVar37 - (long)TVar36;
            if ((long)uVar18 < 0x91) {
              TVar35 = TVar36;
              if (TVar36 != TVar37) {
                while (TVar10 = (Tuple2<pbrt::Point2,_int>)((long)TVar35 + 0x30), TVar10 != TVar37)
                {
                  bVar6 = convert::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)TVar10,(ImageChannelValues *)TVar36,
                                     pIVar22);
                  if (bVar6) {
                    pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                    InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)&desc,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                            *)TVar10);
                    std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
                    __copy_move_b<pbrt::ImageChannelValues*,pbrt::ImageChannelValues*>
                              ((ImageChannelValues *)TVar36,(ImageChannelValues *)TVar10,
                               (ImageChannelValues *)((long)TVar35 + 0x60));
                    pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                    operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                              TVar36,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                      *)&desc);
                  }
                  else {
                    pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                    InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)&desc,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                            *)TVar10);
                    pIVar22 = extraout_RDX_05;
                    while( true ) {
                      bVar6 = convert::anon_class_1_0_00000001::operator()
                                        ((anon_class_1_0_00000001 *)&desc,
                                         (ImageChannelValues *)TVar35,pIVar22);
                      if (!bVar6) break;
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )((long)TVar35 + 0x30),
                                (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )TVar35);
                      pIVar22 = extraout_RDX_06;
                      TVar35 = (Tuple2<pbrt::Point2,_int>)((long)TVar35 + -0x30);
                    }
                    pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                    operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                              ((long)TVar35 + 0x30),
                              (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                              &desc);
                  }
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)&desc);
                  pIVar22 = extraout_RDX_07;
                  TVar35 = TVar10;
                }
              }
            }
            else {
              bVar6 = (Tuple2<pbrt::Point2,_int>)_local_a50 != (Tuple2<pbrt::Point2,_int>)0x0;
              _local_a50 = _local_a50 + -1;
              if (bVar6) goto code_r0x00261c32;
              TVar35 = (Tuple2<pbrt::Point2,_int>)((long)local_a48 + 0x30);
              lVar23 = (long)TVar35 - (long)TVar36;
              _local_a50 = lVar23 / 0x30;
              pIVar22 = (ImageChannelValues *)(lVar23 % 0x30);
              if (0x5f < lVar23) {
                uVar18 = (ulong)(_local_a50 + -2) >> 1;
                other = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        (uVar18 * 0x30 + (long)TVar36);
                do {
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )&desc,other);
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )&splitChannelNames,
                                (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )&desc);
                  std::
                  __adjust_heap<pbrt::ImageChannelValues*,long,pbrt::ImageChannelValues,__gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::__1>>
                            (TVar36,uVar18,_local_a50,&splitChannelNames);
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)&splitChannelNames);
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)&desc);
                  other = other + -1;
                  bVar6 = uVar18 != 0;
                  uVar18 = uVar18 - 1;
                  pIVar22 = extraout_RDX_08;
                } while (bVar6);
              }
              for (; (ulong)TVar35 < (ulong)TVar37;
                  TVar35 = (Tuple2<pbrt::Point2,_int>)((long)TVar35 + 0x30)) {
                bVar6 = convert::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)TVar35,(ImageChannelValues *)TVar36,
                                   pIVar22);
                pIVar22 = extraout_RDX_09;
                if (bVar6) {
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )&desc,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                        *)TVar35);
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                            ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                             TVar35,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)TVar36);
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )&splitChannelNames,
                                (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )&desc);
                  std::
                  __adjust_heap<pbrt::ImageChannelValues*,long,pbrt::ImageChannelValues,__gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::__1>>
                            (TVar36,0,_local_a50,
                             (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                             &splitChannelNames);
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)&splitChannelNames);
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)&desc);
                  pIVar22 = extraout_RDX_10;
                }
              }
              std::swap<pbrt::ImageChannelValues>
                        ((ImageChannelValues *)TVar36,(ImageChannelValues *)local_a48);
            }
          }
          pbrt::Image::SetChannels
                    ((Image *)&channels,(Point2i)local_a38,
                     (ImageChannelValues *)
                     ((long)&((neighbors.
                               super__Vector_base<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             ).alloc.memoryResource + (long)local_a10));
        }
      }
      TVar26 = (Tuple2<pbrt::Point2,_int>)((long)local_a40 + 1);
    }
    pstd::swap<pbrt::Image>(&image,(Image *)&channels);
    fprintf(_stderr,"%s: despiked %d pixels\n",inFile._M_dataplus._M_p,(ulong)local_9dc);
    std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::~vector
              (&neighbors);
    pbrt::Image::~Image((Image *)&channels);
  }
  if ((scale != 1.0) || (NAN(scale))) {
    uVar32 = ~((int)(uint)local_a08 >> 0x1f) & (uint)local_a08;
    local_a48.x = ~(local_a28.x >> 0x1f) & local_a28.x;
    local_a48.y = 0;
    local_a10.x = ~((int)(uint)local_a20 >> 0x1f) & (uint)local_a20;
    local_a10.y = 0;
    TVar11.x = 0;
    TVar11.y = 0;
    while (TVar11 != local_a10) {
      _local_a50 = (long)TVar11 << 0x20;
      TVar20.x = 0;
      TVar20.y = 0;
      local_a38 = TVar11;
      while (TVar20 != local_a48) {
        PVar38.super_Tuple2<pbrt::Point2,_int> = _local_a50 | TVar20;
        local_a40 = TVar20;
        for (uVar30 = 0; fVar40 = scale, uVar32 != uVar30; uVar30 = uVar30 + 1) {
          pbrt::WrapMode2D::WrapMode2D(&local_880,Clamp);
          FVar39 = pbrt::Image::GetChannel(&image,PVar38,uVar30,local_880);
          pbrt::Image::SetChannel(&image,PVar38,uVar30,FVar39 * fVar40);
        }
        TVar20 = (Tuple2<pbrt::Point2,_int>)((long)local_a40 + 1);
      }
      TVar11 = (Tuple2<pbrt::Point2,_int>)((long)local_a38 + 1);
    }
  }
  if ((gamma != 1.0) || (NAN(gamma))) {
    uVar32 = ~((int)(uint)local_a08 >> 0x1f) & (uint)local_a08;
    local_a40.x = ~(local_a28.x >> 0x1f) & local_a28.x;
    local_a40.y = 0;
    local_a38.x = ~((int)(uint)local_a20 >> 0x1f) & (uint)local_a20;
    local_a38.y = 0;
    TVar13.x = 0;
    TVar13.y = 0;
    while (TVar13 != local_a38) {
      local_a48 = (Tuple2<pbrt::Point2,_int>)((long)TVar13 << 0x20);
      TVar12.x = 0;
      TVar12.y = 0;
      _local_a50 = TVar13;
      for (; TVar12 != local_a40; TVar12 = (Tuple2<pbrt::Point2,_int>)((long)TVar12 + 1)) {
        PVar38.super_Tuple2<pbrt::Point2,_int> = local_a48 | TVar12;
        for (uVar30 = 0; uVar32 != uVar30; uVar30 = uVar30 + 1) {
          pbrt::WrapMode2D::WrapMode2D(&local_888,Clamp);
          auVar44._0_4_ = pbrt::Image::GetChannel(&image,PVar38,uVar30,local_888);
          auVar44._4_60_ = extraout_var;
          auVar42 = vmaxss_avx(auVar44._0_16_,ZEXT416(0));
          fVar40 = powf(auVar42._0_4_,gamma);
          pbrt::Image::SetChannel(&image,PVar38,uVar30,fVar40);
        }
      }
      TVar13 = (Tuple2<pbrt::Point2,_int>)(_local_a50 + 1);
    }
  }
  if (tonemap == true) {
    uVar32 = ~((int)(uint)local_a08 >> 0x1f) & (uint)local_a08;
    local_a48.x = ~(local_a28.x >> 0x1f) & local_a28.x;
    local_a48.y = 0;
    local_a10.x = ~((int)(uint)local_a20 >> 0x1f) & (uint)local_a20;
    local_a10.y = 0;
    TVar14.x = 0;
    TVar14.y = 0;
    while (TVar14 != local_a10) {
      _local_a50 = (long)TVar14 << 0x20;
      local_a40.x = 0;
      local_a40.y = 0;
      local_a38 = TVar14;
      for (; local_a40 != local_a48; local_a40 = (Tuple2<pbrt::Point2,_int>)((long)local_a40 + 1)) {
        pbrt::WrapMode2D::WrapMode2D(&local_890,Clamp);
        PVar38.super_Tuple2<pbrt::Point2,_int> = _local_a50 | local_a40;
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)
                   &channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   ,&image,PVar38,local_890);
        FVar39 = pbrt::ImageChannelValues::Average
                           ((ImageChannelValues *)
                            &channels.
                             super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                           );
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  (&channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                  );
        fVar40 = maxY * maxY;
        for (uVar30 = 0; uVar32 != uVar30; uVar30 = uVar30 + 1) {
          pbrt::WrapMode2D::WrapMode2D(&local_898,Clamp);
          FVar41 = pbrt::Image::GetChannel(&image,PVar38,uVar30,local_898);
          pbrt::Image::SetChannel
                    (&image,PVar38,uVar30,FVar41 * ((FVar39 / fVar40 + 1.0) / (FVar39 + 1.0)));
        }
      }
      TVar14 = (Tuple2<pbrt::Point2,_int>)((long)local_a38 + 1);
    }
  }
  if (preserveColors == true) {
    uVar32 = ~((int)(uint)local_a08 >> 0x1f) & (uint)local_a08;
    local_a48.x = ~(local_a28.x >> 0x1f) & local_a28.x;
    local_a48.y = 0;
    local_a10.x = ~((int)(uint)local_a20 >> 0x1f) & (uint)local_a20;
    local_a10.y = 0;
    TVar15.x = 0;
    TVar15.y = 0;
    while (TVar15 != local_a10) {
      _local_a50 = (long)TVar15 << 0x20;
      local_a40.x = 0;
      local_a40.y = 0;
      local_a38 = TVar15;
      for (; local_a40 != local_a48; local_a40 = (Tuple2<pbrt::Point2,_int>)((long)local_a40 + 1)) {
        pbrt::WrapMode2D::WrapMode2D(&local_8a0,Clamp);
        PVar38.super_Tuple2<pbrt::Point2,_int> = _local_a50 | local_a40;
        fVar40 = pbrt::Image::GetChannel(&image,PVar38,0,local_8a0);
        iVar19 = 1;
        while (iVar19 < (int)(uint)local_a08) {
          pbrt::WrapMode2D::WrapMode2D(&local_8a8,Clamp);
          auVar45._0_4_ = pbrt::Image::GetChannel(&image,PVar38,iVar19,local_8a8);
          auVar45._4_60_ = extraout_var_00;
          iVar19 = iVar19 + 1;
          auVar42 = vmaxss_avx(auVar45._0_16_,ZEXT416((uint)fVar40));
          fVar40 = auVar42._0_4_;
        }
        if (1.0 < fVar40) {
          for (uVar30 = 0; uVar32 != uVar30; uVar30 = uVar30 + 1) {
            pbrt::WrapMode2D::WrapMode2D(&local_8b0,Clamp);
            FVar39 = pbrt::Image::GetChannel(&image,PVar38,uVar30,local_8b0);
            pbrt::Image::SetChannel(&image,PVar38,uVar30,FVar39 / fVar40);
          }
        }
      }
      TVar15 = (Tuple2<pbrt::Point2,_int>)((long)local_a38 + 1);
    }
  }
  if (acesFilmic == true) {
    uVar32 = ~((int)(uint)local_a08 >> 0x1f) & (uint)local_a08;
    local_a40.x = ~(local_a28.x >> 0x1f) & local_a28.x;
    local_a40.y = 0;
    local_a38.x = ~((int)(uint)local_a20 >> 0x1f) & (uint)local_a20;
    local_a38.y = 0;
    TVar17.x = 0;
    TVar17.y = 0;
    while (TVar17 != local_a38) {
      local_a48 = (Tuple2<pbrt::Point2,_int>)((long)TVar17 << 0x20);
      TVar16.x = 0;
      TVar16.y = 0;
      _local_a50 = TVar17;
      for (; TVar16 != local_a40; TVar16 = (Tuple2<pbrt::Point2,_int>)((long)TVar16 + 1)) {
        PVar38.super_Tuple2<pbrt::Point2,_int> = local_a48 | TVar16;
        for (uVar30 = 0; uVar32 != uVar30; uVar30 = uVar30 + 1) {
          pbrt::WrapMode2D::WrapMode2D(&local_8b8,Clamp);
          auVar46._0_4_ = pbrt::Image::GetChannel(&image,PVar38,uVar30,local_8b8);
          auVar46._4_60_ = extraout_var_01;
          auVar42 = auVar46._0_16_;
          FVar39 = 0.0;
          if (0.0 < auVar46._0_4_) {
            auVar48 = vfmadd213ss_fma(SUB6416(ZEXT464(0x401b851f),0),auVar42,ZEXT416(0x3f170a3d));
            auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x4020a3d7),0),auVar42,ZEXT416(0x3cf5c28f));
            auVar42 = vfmadd213ss_fma(auVar48,auVar42,ZEXT416(0x3e0f5c29));
            auVar48 = ZEXT416((uint)((auVar46._0_4_ * auVar2._0_4_) / auVar42._0_4_));
            auVar42 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar48);
            uVar1 = vcmpss_avx512f(auVar48,ZEXT816(0) << 0x20,1);
            FVar39 = (Float)((uint)!(bool)((byte)uVar1 & 1) * auVar42._0_4_);
          }
          pbrt::Image::SetChannel(&image,PVar38,uVar30,FVar39);
        }
      }
      TVar17 = (Tuple2<pbrt::Point2,_int>)(_local_a50 + 1);
    }
  }
  iVar19 = repeat;
  if (1 < repeat) {
    pbrt::Image::ChannelNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&desc,&image);
    pVar3 = desc.offset.alloc;
    iVar21 = iVar19 * (int)local_a20;
    PVar25.super_Tuple2<pbrt::Point2,_int>.x = iVar19 * local_a28.x;
    lVar23 = (long)desc.offset.ptr - (long)desc.offset.alloc.memoryResource;
    local_420 = image.encoding.
                super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                .bits;
    AVar8.memoryResource = pstd::pmr::new_delete_resource();
    PVar25.super_Tuple2<pbrt::Point2,_int>.y = iVar21;
    channels_00.n = lVar23 >> 5;
    channels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar3.memoryResource;
    pbrt::Image::Image((Image *)&channels,image.format,PVar25,channels_00,
                       (ColorEncodingHandle *)&local_420,AVar8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&desc);
    TVar28.x = 0;
    TVar28.y = 0;
    uVar32 = ~((int)(uint)local_a08 >> 0x1f) & (uint)local_a08;
    iVar19 = repeat;
    while ((long)TVar28 < (long)(iVar19 * (int)local_a20)) {
      local_a08 = (long)((ulong)(uint)(TVar28.x >> 0x1f) << 0x20 | (ulong)TVar28 & 0xffffffff) /
                  (long)iVar19 << 0x20;
      local_a40 = (Tuple2<pbrt::Point2,_int>)((long)TVar28 << 0x20);
      local_a48 = TVar28;
      for (uVar27 = 0; (long)uVar27 < (long)(iVar19 * local_a28.x); uVar27 = uVar27 + 1) {
        PVar38.super_Tuple2<pbrt::Point2,_int> = local_a40 | uVar27;
        PVar25.super_Tuple2<pbrt::Point2,_int> =
             (Tuple2<pbrt::Point2,_int>)
             ((long)((ulong)(uint)((int)uVar27 >> 0x1f) << 0x20 | uVar27 & 0xffffffff) /
              (long)iVar19 & 0xffffffffU | local_a08);
        for (uVar30 = 0; uVar32 != uVar30; uVar30 = uVar30 + 1) {
          pbrt::WrapMode2D::WrapMode2D(&local_8c0,Clamp);
          FVar39 = pbrt::Image::GetChannel(&image,PVar25,uVar30,local_8c0);
          pbrt::Image::SetChannel((Image *)&channels,PVar38,uVar30,FVar39);
        }
        iVar19 = repeat;
      }
      TVar28 = (Tuple2<pbrt::Point2,_int>)((long)local_a48 + 1);
    }
    pbrt::Image::operator=(&image,(Image *)&channels);
    pbrt::Image::~Image((Image *)&channels);
  }
  if (flipy == true) {
    pbrt::Image::FlipY(&image);
  }
  local_590 = (_Base_ptr)&pStack_5a0;
  aStack_5b8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
  sStack_5b0 = 0;
  sStack_5a8 = 0;
  pStack_5a0.memoryResource = (memory_resource *)0x0;
  p_Stack_598 = (_Base_ptr)0x0;
  local_638._64_8_ = (pointer)0x0;
  local_638[0x48] = (string)0x0;
  local_638[0x49] = (string)0x0;
  local_638[0x4a] = (string)0x0;
  local_638[0x4b] = (string)0x0;
  local_638[0x4c] = (string)0x0;
  local_638[0x4d] = (string)0x0;
  local_638[0x4e] = (string)0x0;
  local_638[0x4f] = (string)0x0;
  aStack_5e8._0_8_ = 0;
  aStack_5e8._8_8_ = 0;
  sStack_5d8 = 0;
  local_5d0 = 0;
  oStack_5c8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  oStack_5c8.set = false;
  oStack_5c8._5_3_ = 0;
  oStack_5c0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  oStack_5c0.set = false;
  oStack_5c0._5_3_ = 0;
  local_638._0_8_ = (pointer)0x0;
  local_638[8] = (string)0x0;
  local_638[9] = (string)0x0;
  local_638[10] = (string)0x0;
  local_638[0xb] = (string)0x0;
  local_638[0xc] = (string)0x0;
  local_638[0xd] = (string)0x0;
  local_638[0xe] = (string)0x0;
  local_638[0xf] = (string)0x0;
  local_638[0x10] = (string)0x0;
  local_638[0x11] = (string)0x0;
  local_638[0x12] = (string)0x0;
  local_638[0x13] = (string)0x0;
  local_638[0x14] = (string)0x0;
  local_638[0x15] = (string)0x0;
  local_638[0x16] = (string)0x0;
  local_638[0x17] = (string)0x0;
  local_638[0x18] = (string)0x0;
  local_638[0x19] = (string)0x0;
  local_638[0x1a] = (string)0x0;
  local_638[0x1b] = (string)0x0;
  local_638[0x1c] = (string)0x0;
  local_638[0x1d] = (string)0x0;
  local_638[0x1e] = (string)0x0;
  local_638[0x1f] = (string)0x0;
  local_638._32_8_ = (pointer)0x0;
  local_638[0x28] = (string)0x0;
  local_638[0x29] = (string)0x0;
  local_638[0x2a] = (string)0x0;
  local_638[0x2b] = (string)0x0;
  local_638[0x2c] = (string)0x0;
  local_638[0x2d] = (string)0x0;
  local_638[0x2e] = (string)0x0;
  local_638[0x2f] = (string)0x0;
  local_638[0x30] = (string)0x0;
  local_638[0x31] = (string)0x0;
  local_638[0x32] = (string)0x0;
  local_638[0x33] = (string)0x0;
  local_638[0x34] = (string)0x0;
  local_638[0x35] = (string)0x0;
  local_638[0x36] = (string)0x0;
  local_638[0x37] = (string)0x0;
  local_638[0x38] = (string)0x0;
  local_638[0x39] = (string)0x0;
  local_638[0x3a] = (string)0x0;
  local_638[0x3b] = (string)0x0;
  local_638[0x3c] = (string)0x0;
  local_638[0x3d] = (string)0x0;
  local_638[0x3e] = (string)0x0;
  local_638[0x3f] = (string)0x0;
  channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
  memoryResource = (memory_resource *)0x0;
  channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr =
       (float *)0x0;
  channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2._0_8_ = 0
  ;
  channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2._8_8_ = 0
  ;
  channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc = 0;
  channels.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored = 0;
  local_580.memoryResource = (memory_resource *)0x0;
  local_588 = local_590;
  bVar6 = pbrt::Image::Write(&image,&outFile,(ImageMetadata *)&channels);
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)&channels);
  uVar32 = (uint)!bVar6;
LAB_002618b6:
  pbrt::ImageMetadata::~ImageMetadata(&metadata);
  pbrt::Image::~Image(&image);
  pbrt::ImageAndMetadata::~ImageAndMetadata(&imRead);
  std::__cxx11::string::~string((string *)&channelNames);
  std::__cxx11::string::~string((string *)&colorspace);
  std::__cxx11::string::~string((string *)&outFile);
  std::__cxx11::string::~string((string *)&inFile);
  return uVar32;
code_r0x00261c32:
  TVar10 = (Tuple2<pbrt::Point2,_int>)((long)TVar36 + 0x30);
  TVar26 = (Tuple2<pbrt::Point2,_int>)((uVar18 / 0x60) * 0x30 + (long)TVar36);
  bVar6 = convert::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)TVar10,(ImageChannelValues *)TVar26,
                     (ImageChannelValues *)(uVar18 % 0x60));
  TVar35 = (Tuple2<pbrt::Point2,_int>)((long)TVar37 + -0x30);
  if (bVar6) {
    bVar6 = convert::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)TVar26,(ImageChannelValues *)TVar35,b);
    TVar11 = TVar10;
    pIVar22 = extraout_RDX;
  }
  else {
    bVar6 = convert::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)TVar10,(ImageChannelValues *)TVar35,b);
    TVar11 = TVar26;
    pIVar22 = extraout_RDX_00;
    TVar26 = TVar10;
  }
  if ((bVar6 == false) &&
     (bVar6 = convert::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)TVar11,(ImageChannelValues *)TVar35,pIVar22),
     TVar26 = TVar11, bVar6)) {
    TVar26 = TVar35;
  }
  std::swap<pbrt::ImageChannelValues>((ImageChannelValues *)TVar36,(ImageChannelValues *)TVar26);
  pIVar22 = extraout_RDX_01;
  TVar26 = TVar37;
  while( true ) {
    do {
      TVar35 = TVar10;
      bVar6 = convert::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)TVar35,(ImageChannelValues *)TVar36,pIVar22);
      pIVar22 = extraout_RDX_02;
      TVar10 = (Tuple2<pbrt::Point2,_int>)((long)TVar35 + 0x30);
    } while (bVar6);
    do {
      TVar26 = (Tuple2<pbrt::Point2,_int>)((long)TVar26 + -0x30);
      bVar6 = convert::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)TVar36,(ImageChannelValues *)TVar26,pIVar22);
      pIVar22 = extraout_RDX_03;
    } while (bVar6);
    if ((ulong)TVar26 <= (ulong)TVar35) break;
    std::swap<pbrt::ImageChannelValues>((ImageChannelValues *)TVar35,(ImageChannelValues *)TVar26);
    pIVar22 = extraout_RDX_04;
  }
  if ((ulong)TVar35 <= (ulong)local_a48) {
    TVar36 = TVar35;
    TVar35 = TVar37;
  }
  goto LAB_00261c11;
}

Assistant:

int convert(int argc, char *argv[]) {
    bool acesFilmic = false;
    float scale = 1.f, gamma = 1.f;
    int repeat = 1;
    bool flipy = false;
    bool tonemap = false;
    Float maxY = 1.;
    Float despikeLimit = Infinity;
    bool preserveColors = false;
    bool bw = false;
    std::string inFile, outFile;
    std::string colorspace;
    std::string channelNames;
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("convert", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "acesfilmic", &acesFilmic, onError) ||
            ParseArg(&argv, "bw", &bw, onError) ||
            ParseArg(&argv, "channels", &channelNames, onError) ||
            ParseArg(&argv, "colorspace", &colorspace, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError) ||
            ParseArg(&argv, "despike", &despikeLimit, onError) ||
            ParseArg(&argv, "flipy", &flipy, onError) ||
            ParseArg(&argv, "gamma", &gamma, onError) ||
            ParseArg(&argv, "maxluminance", &maxY, onError) ||
            ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "preservecolors", &preserveColors, onError) ||
            ParseArg(&argv, "repeatpix", &repeat, onError) ||
            ParseArg(&argv, "scale", &scale, onError) ||
            ParseArg(&argv, "tonemap", &tonemap, onError)) {
            // success
        } else if (argv[0][0] != '-' && inFile.empty()) {
            inFile = *argv;
            ++argv;
        } else
            usage("convert", "%s: unknown command flag", *argv);
    }

    if (maxY <= 0)
        usage("convert", "--maxluminance value must be greater than zero");
    if (repeat <= 0)
        usage("convert", "--repeatpix value must be greater than zero");
    if (scale == 0)
        usage("convert", "--scale value must be non-zero");
    if (outFile.empty())
        usage("convert", "--outfile filename must be specified");
    if (inFile.empty())
        usage("convert", "input filename not specified");

    ImageAndMetadata imRead = Image::Read(inFile);
    Image image = std::move(imRead.image);
    ImageMetadata metadata = std::move(imRead.metadata);

    if (channelNames.empty()) {
        // If the input image has AOVs and the target image is a regular
        // format, then just grab R,G,B...
        bool hasAOVs = false;
        for (const std::string &name : image.ChannelNames())
            if (name != "R" && name != "G" && name != "B" && name != "A") {
                hasAOVs = true;
                break;
            }

        if (hasAOVs && !HasExtension(outFile, "exr")) {
            fprintf(stderr,
                    "%s: image has non-RGB channels but converting to an "
                    "image format that can't store them. Converting RGB only.\n",
                    inFile.c_str());
            channelNames = "R,G,B";
        }
    }

    if (!channelNames.empty()) {
        std::vector<std::string> splitChannelNames = SplitString(channelNames, ',');
        ImageChannelDesc desc = image.GetChannelDesc(splitChannelNames);
        if (!desc) {
            fprintf(stderr, "%s: image doesn't have channels \"%s\".\n", inFile.c_str(),
                    channelNames.c_str());
            return 1;
        }
        image = image.SelectChannels(desc);
    }

    Point2i res = image.Resolution();
    int nc = image.NChannels();

    // Crop
    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0) {
        image = image.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));
        res = image.Resolution();
    }

    // Convert to a 32-bit format for maximum accuracy in the following
    // processing.
    if (!Is32Bit(image.Format()))
        image = image.ConvertToFormat(PixelFormat::Float);

    if (!colorspace.empty()) {
        const RGBColorSpace *dest = RGBColorSpace::GetNamed(colorspace);
        if (!dest) {
            fprintf(stderr, "%s: color space unknown.\n", colorspace.c_str());
            return 1;
        }
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (!rgbDesc) {
            fprintf(stderr, "%s: doesn't have R, G, B channels.\n", inFile.c_str());
            return 1;
        }

        const RGBColorSpace *srcColorSpace = (metadata.colorSpace && *metadata.colorSpace)
                                                 ? *metadata.colorSpace
                                                 : RGBColorSpace::sRGB;
        SquareMatrix<3> m = ConvertRGBColorSpace(*srcColorSpace, *dest);
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                ImageChannelValues channels = image.GetChannels({x, y}, rgbDesc);
                RGB rgb = Mul<RGB>(m, channels);
                image.SetChannels({x, y}, rgbDesc, {rgb.r, rgb.g, rgb.b});
            }
        metadata.colorSpace = dest;
    }

    if (bw) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float sum = 0;
                for (int c = 0; c < nc; ++c)
                    sum += image.GetChannel({x, y}, c);
                sum /= nc;
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, sum);
            }
    }

    if (despikeLimit < Infinity) {
        Image filteredImg = image;
        int despikeCount = 0;
        std::vector<ImageChannelValues> neighbors;
        for (int i = 0; i < 9; ++i)
            neighbors.push_back(ImageChannelValues(image.NChannels()));

        for (int y = 0; y < res.y; ++y) {
            for (int x = 0; x < res.x; ++x) {
                if (image.GetChannels({x, y}).Average() < despikeLimit)
                    continue;

                // Copy all of the valid neighbor pixels into neighbors[].
                ++despikeCount;
                int validNeighbors = 0;
                for (int dy = -1; dy <= 1; ++dy) {
                    if (y + dy < 0 || y + dy >= res.y)
                        continue;
                    for (int dx = -1; dx <= 1; ++dx) {
                        if (x + dx < 0 || x + dx > res.x)
                            continue;
                        neighbors[validNeighbors++] = image.GetChannels({x + dx, y + dy});
                    }
                }

                // Find the median of the neighbors, sorted by average value.
                int mid = validNeighbors / 2;
                std::nth_element(
                    &neighbors[0], &neighbors[mid], &neighbors[validNeighbors],
                    [](const ImageChannelValues &a, const ImageChannelValues &b) -> bool {
                        return a.Average() < b.Average();
                    });
                filteredImg.SetChannels({x, y}, neighbors[mid]);
            }
        }
        pstd::swap(image, filteredImg);
        fprintf(stderr, "%s: despiked %d pixels\n", inFile.c_str(), despikeCount);
    }

    if (scale != 1) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, scale * image.GetChannel({x, y}, c));
    }

    if (gamma != 1) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < nc; ++c)
                    image.SetChannel(
                        {x, y}, c,
                        std::pow(std::max<Float>(0, image.GetChannel({x, y}, c)), gamma));
    }

    if (tonemap) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float lum = image.GetChannels({x, y}).Average();
                // Reinhard et al. photographic tone mapping operator.
                Float scale = (1 + lum / (maxY * maxY)) / (1 + lum);
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, scale * image.GetChannel({x, y}, c));
            }
    }

    if (preserveColors) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float m = image.GetChannel({x, y}, 0);
                for (int c = 1; c < nc; ++c)
                    m = std::max(m, image.GetChannel({x, y}, c));
                if (m > 1) {
                    for (int c = 0; c < nc; ++c)
                        image.SetChannel({x, y}, c, image.GetChannel({x, y}, c) / m);
                }
            }
    }

    if (acesFilmic) {
        // Approximation via
        // https://knarkowicz.wordpress.com/2016/01/06/aces-filmic-tone-mapping-curve/
        auto ACESFilm = [](Float x) -> Float {
            if (x <= 0)
                return 0;
            Float a = 2.51f;
            Float b = 0.03f;
            Float c = 2.43f;
            Float d = 0.59f;
            Float e = 0.14f;
            return Clamp((x * (a * x + b)) / (x * (c * x + d) + e), 0, 1);
        };

        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                for (int c = 0; c < nc; ++c) {
                    Float v = image.GetChannel({x, y}, c);
                    v = ACESFilm(v);
                    image.SetChannel({x, y}, c, v);
                }
            }
    }

    if (repeat > 1) {
        Image scaledImage(image.Format(), Point2i(res.x * repeat, res.y * repeat),
                          image.ChannelNames(), image.Encoding());
        for (int y = 0; y < repeat * res.y; ++y) {
            int yy = y / repeat;
            for (int x = 0; x < repeat * res.x; ++x) {
                int xx = x / repeat;
                for (int c = 0; c < nc; ++c)
                    scaledImage.SetChannel({x, y}, c, image.GetChannel({xx, yy}, c));
            }
        }
        image = std::move(scaledImage);
        res = image.Resolution();
    }

    if (flipy)
        image.FlipY();

    if (!image.Write(outFile))
        return 1;

    return 0;
}